

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O1

bool __thiscall
xmrig::SelfSelectClient::parseResponse(SelfSelectClient *this,int64_t id,Value *result,Value *error)

{
  undefined8 uVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  char *pcVar6;
  long lVar7;
  undefined4 extraout_var_00;
  Type pGVar8;
  uint64_t uVar9;
  undefined4 extraout_var_01;
  Type blob;
  undefined8 local_38;
  
  if (id != -1) {
    if ((error->data_).f.flags == 3) {
      iVar4 = (*(this->super_IClient)._vptr_IClient[10])(this);
      uVar1 = *(undefined8 *)(CONCAT44(extraout_var,iVar4) + 0x70);
      pcVar6 = Json::getString(error,"message",(char *)0x0);
      uVar5 = Json::getInt(error,"code",0);
      Log::print(ERR,"[%s] error: \x1b[1;31m\"%s\"\x1b[0m\x1b[0;31m, code: %d",uVar1,pcVar6,
                 (ulong)uVar5);
      return false;
    }
    if ((result->data_).f.flags == 3) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&stack0xffffffffffffffc8,(Ch *)result);
      if (local_38 ==
          (ulong)(result->data_).s.length * 0x20 + ((ulong)(result->data_).s.str & 0xffffffffffff))
      {
        iVar4 = (*(this->super_IClient)._vptr_IClient[10])(this);
        Log::print(ERR,"[%s] required field \x1b[1;31m\"%s\"\x1b[0m\x1b[0;31m not found",
                   *(undefined8 *)(CONCAT44(extraout_var_01,iVar4) + 0x70),"blocktemplate_blob");
        return false;
      }
      lVar2 = 0;
      do {
        lVar7 = lVar2;
        if (lVar7 == 0x20) goto LAB_001589b6;
        uVar1 = *(undefined8 *)(required_fields + lVar7 + 8);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&stack0xffffffffffffffc8,(Ch *)result);
        lVar2 = lVar7 + 8;
      } while (local_38 !=
               (ulong)(result->data_).s.length * 0x20 +
               ((ulong)(result->data_).s.str & 0xffffffffffff));
      iVar4 = (*(this->super_IClient)._vptr_IClient[10])();
      Log::print(ERR,"[%s] required field \x1b[1;31m\"%s\"\x1b[0m\x1b[0;31m not found",
                 *(undefined8 *)(CONCAT44(extraout_var_00,iVar4) + 0x70),uVar1);
      if (lVar7 != 0x20) {
        return false;
      }
LAB_001589b6:
      pGVar8 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)result,"blockhashing_blob");
      blob = (Type)((ulong)(pGVar8->data_).s.str & 0xffffffffffff);
      if (((pGVar8->data_).f.flags >> 0xc & 1) != 0) {
        blob = pGVar8;
      }
      bVar3 = Job::setBlob(&this->m_job,(char *)blob);
      if (bVar3) {
        uVar9 = Json::getUint64(result,"height",0);
        (this->m_job).m_height = uVar9;
        submitBlockTemplate(this,result);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool xmrig::SelfSelectClient::parseResponse(int64_t id, rapidjson::Value &result, const rapidjson::Value &error)
{
    if (id == -1) {
        return false;
    }

    if (error.IsObject()) {
        LOG_ERR("[%s] error: " RED_BOLD("\"%s\"") RED_S ", code: %d", pool().daemon().url().data(), Json::getString(error, "message"), Json::getInt(error, "code"));

        return false;
    }

    if (!result.IsObject()) {
        return false;
    }

    for (auto field : required_fields) {
        if (!result.HasMember(field)) {
            LOG_ERR("[%s] required field " RED_BOLD("\"%s\"") RED_S " not found", pool().daemon().url().data(), field);

            return false;
        }
    }

    if (!m_job.setBlob(result[kBlockhashingBlob].GetString())) {
        return false;
    }

    m_job.setHeight(Json::getUint64(result, kHeight));

    submitBlockTemplate(result);

    return true;
}